

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

void __thiscall TextReader::parse_dec(TextReader *this)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  string local_38;
  
  uVar2 = (this->current_line_)._M_string_length;
  pcVar3 = (this->current_line_)._M_dataplus._M_p;
  sVar5 = this->current_token_len_ + 1;
  uVar4 = this->current_token_pos_ + sVar5;
  do {
    uVar6 = uVar4;
    this->current_token_len_ = sVar5;
    if (uVar2 <= uVar6) {
      return;
    }
    sVar5 = sVar5 + 1;
    uVar4 = uVar6 + 1;
  } while ((byte)(pcVar3[uVar6] - 0x30U) < 10);
  if ((uVar6 < uVar2) &&
     ((cVar1 = (this->current_line_)._M_dataplus._M_p[uVar6],
      (byte)(cVar1 + 0xbfU) < 0x1a || (byte)(cVar1 - 0x30U) < 10 ||
      (cVar1 == '_' || (byte)(cVar1 + 0x9fU) < 0x1a)))) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Invalid symbol in decimal value","");
    parse_error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void parse_dec() {
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_dec_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_DEC_INVALID_SYMBOL);
        };
    }